

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValueAndRemove
          (BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int *key,SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> **value)

{
  int iVar1;
  Type piVar2;
  Type pSVar3;
  bool bVar4;
  uint depth;
  uint uVar5;
  uint unaff_R15D;
  hash_t local_34;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 == (Type)0x0) {
    uVar5 = 0;
  }
  else {
    local_34 = PrimePolicy::ModPrime(*key & 0x7fffffff,this->bucketCount,this->modFunctionIndex);
    unaff_R15D = piVar2[local_34];
    if (-1 < (long)(int)unaff_R15D) {
      pSVar3 = this->entries;
      if (pSVar3[(int)unaff_R15D].
          super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>.
          super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
          .
          super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
          .key == *key) {
        depth = 0;
        uVar5 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar5 = unaff_R15D;
          depth = depth + 1;
          unaff_R15D = pSVar3[uVar5].
                       super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .
                       super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                       .
                       super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                       .
                       super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                       .next;
          if ((long)(int)unaff_R15D < 0) goto LAB_007c4d41;
        } while (pSVar3[(int)unaff_R15D].
                 super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .
                 super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                 .
                 super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                 .
                 super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                 .key != *key);
      }
      bVar4 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      goto LAB_007c4d55;
    }
    uVar5 = 0xffffffff;
  }
LAB_007c4d41:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  bVar4 = false;
LAB_007c4d55:
  if (bVar4 != false) {
    *value = this->entries[(int)unaff_R15D].
             super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .
             super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
             .
             super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
             .
             super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
             .value;
    iVar1 = this->entries[(int)unaff_R15D].
            super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
            .
            super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
            .
            super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
            .next;
    if ((int)uVar5 < 0) {
      this->buckets[local_34] = iVar1;
    }
    else {
      this->entries[uVar5].
      super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>.
      super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
      .
      super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
      .next = iVar1;
    }
    pSVar3 = this->entries;
    pSVar3[(int)unaff_R15D].
    super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>.
    super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
    .
    super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
    .value = (SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    pSVar3[(int)unaff_R15D].
    super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>.
    super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
    .
    super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
    .key = 0;
    SetNextFreeEntryIndex
              (this,this->entries + (int)unaff_R15D,-(uint)(this->freeCount == 0) | this->freeList);
    this->freeList = unaff_R15D;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->buckets[local_34] == -1);
    }
  }
  return bVar4;
}

Assistant:

bool TryGetValueAndRemove(const TKey& key, TValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = entries[i].Value();
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }